

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::BrandedDecl
          (BrandedDecl *this,ResolvedDecl *decl,
          Own<capnp::compiler::NodeTranslator::BrandScope> *brand,Reader source)

{
  BrandScope *pBVar1;
  
  (this->body).tag = 0;
  pBVar1 = brand->ptr;
  (this->brand).disposer = brand->disposer;
  (this->brand).ptr = pBVar1;
  brand->ptr = (BrandScope *)0x0;
  (this->source)._reader.dataSize = source._reader.dataSize;
  (this->source)._reader.pointerCount = source._reader.pointerCount;
  *(undefined2 *)&(this->source)._reader.field_0x26 = source._reader._38_2_;
  (this->source)._reader.nestingLimit = source._reader.nestingLimit;
  *(undefined4 *)&(this->source)._reader.field_0x2c = source._reader._44_4_;
  (this->source)._reader.data = source._reader.data;
  (this->source)._reader.pointers = source._reader.pointers;
  (this->source)._reader.segment = source._reader.segment;
  (this->source)._reader.capTable = source._reader.capTable;
  kj::
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  ::
  init<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>
            (&this->body,decl);
  return;
}

Assistant:

inline BrandedDecl(Resolver::ResolvedDecl decl,
                     kj::Own<NodeTranslator::BrandScope>&& brand,
                     Expression::Reader source)
      : brand(kj::mv(brand)), source(source) {
    body.init<Resolver::ResolvedDecl>(kj::mv(decl));
  }